

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void hermite_1_set(int n,double *x,double *w)

{
  ostream *poVar1;
  
  switch(n) {
  case 1:
    *x = 0.0;
    *w = 1.772453850905516;
    break;
  case 2:
    *x = -0.7071067811865476;
    x[1] = 0.7071067811865476;
    *w = 1.4611411826611391;
    w[1] = 1.4611411826611391;
    break;
  case 3:
    *x = -1.224744871391589;
    x[1] = 0.0;
    x[2] = 1.224744871391589;
    *w = 1.3239311752136438;
    w[1] = 1.1816359006036774;
    w[2] = 1.3239311752136438;
    break;
  case 4:
    *x = -1.6506801238857844;
    x[1] = -0.5246476232752904;
    x[2] = 0.5246476232752904;
    x[3] = 1.6506801238857844;
    *w = 1.240225817695815;
    w[1] = 1.0599644828949693;
    w[2] = 1.0599644828949693;
    w[3] = 1.240225817695815;
    break;
  case 5:
    *x = -2.0201828704560856;
    x[1] = -0.9585724646138185;
    x[2] = 0.0;
    x[3] = 0.9585724646138185;
    x[4] = 2.0201828704560856;
    *w = 1.1814886255359869;
    w[1] = 0.9865809967514283;
    w[2] = 0.9453087204829419;
    w[3] = 0.9865809967514283;
    w[4] = 1.1814886255359869;
    break;
  case 6:
    *x = -2.3506049736744923;
    x[1] = -1.335849074013697;
    x[2] = -0.4360774119276165;
    x[3] = 0.4360774119276165;
    x[4] = 1.335849074013697;
    x[5] = 2.3506049736744923;
    *w = 1.1369083326745253;
    w[1] = 0.9355805576311808;
    w[2] = 0.8764013344362306;
    w[3] = 0.8764013344362306;
    w[4] = 0.9355805576311808;
    w[5] = 1.1369083326745253;
    break;
  case 7:
    *x = -2.6519613568352334;
    x[1] = -1.6735516287674714;
    x[2] = -0.8162878828589647;
    x[3] = 0.0;
    x[4] = 0.8162878828589647;
    x[5] = 1.6735516287674714;
    x[6] = 2.6519613568352334;
    *w = 1.1013307296103216;
    w[1] = 0.8971846002251841;
    w[2] = 0.8286873032836393;
    w[3] = 0.8102646175568073;
    w[4] = 0.8286873032836393;
    w[5] = 0.8971846002251841;
    w[6] = 1.1013307296103216;
    break;
  case 8:
    *x = -2.930637420257244;
    x[1] = -1.981656756695843;
    x[2] = -1.1571937124467802;
    x[3] = -0.3811869902073221;
    x[4] = 0.3811869902073221;
    x[5] = 1.1571937124467802;
    x[6] = 1.981656756695843;
    x[7] = 2.930637420257244;
    *w = 1.0719301442479805;
    w[1] = 0.8667526065633814;
    w[2] = 0.7928900483864013;
    w[3] = 0.7645441286517292;
    w[4] = 0.7645441286517292;
    w[5] = 0.7928900483864013;
    w[6] = 0.8667526065633814;
    w[7] = 1.0719301442479805;
    break;
  case 9:
    *x = -3.1909932017815277;
    x[1] = -2.266580584531843;
    x[2] = -1.468553289216668;
    x[3] = -0.7235510187528376;
    x[4] = 0.0;
    x[5] = 0.7235510187528376;
    x[6] = 1.468553289216668;
    x[7] = 2.266580584531843;
    x[8] = 3.1909932017815277;
    *w = 1.0470035809766838;
    w[1] = 0.8417527014786704;
    w[2] = 0.7646081250945502;
    w[3] = 0.7303024527450922;
    w[4] = 0.720235215606051;
    w[5] = 0.7303024527450922;
    w[6] = 0.7646081250945502;
    w[7] = 0.8417527014786704;
    w[8] = 1.0470035809766838;
    break;
  case 10:
    *x = -3.4361591188377374;
    x[1] = -2.5327316742327897;
    x[2] = -1.7566836492998819;
    x[3] = -1.0366108297895136;
    x[4] = -0.3429013272237046;
    x[5] = 0.3429013272237046;
    x[6] = 1.0366108297895136;
    x[7] = 1.7566836492998819;
    x[8] = 2.5327316742327897;
    x[9] = 3.4361591188377374;
    *w = 1.0254516913657352;
    w[1] = 0.8206661264048164;
    w[2] = 0.7414419319435651;
    w[3] = 0.7032963231049061;
    w[4] = 0.6870818539512734;
    w[5] = 0.6870818539512734;
    w[6] = 0.7032963231049061;
    w[7] = 0.7414419319435651;
    w[8] = 0.8206661264048164;
    w[9] = 1.0254516913657352;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"HERMITE_1_SET - Fatal error!\n");
    poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal value of N = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)&std::cerr,"  Legal values are 1 to 10.\n");
    exit(1);
  }
  return;
}

Assistant:

void hermite_1_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_1_SET sets abscissas and weights for Hermite quadrature.
//
//  Discussion:
//  
//    This routine is for the case with unit density:
//      integral ( -oo < x < +oo ) f(x) dx
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 May 2014
//  
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order.
//    N must be between 1 and 10.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  if ( n == 1 )
  {
    x[0] = 0.0;

    w[0] = 1.7724538509055161;
  }
  else if ( n == 2 )
  {
    x[0] = - 0.707106781186547524400844362105;
    x[1] =   0.707106781186547524400844362105;

    w[0] = 1.4611411826611391;
    w[1] = 1.4611411826611391;
  }
  else if ( n == 3 )
  {
    x[0] = - 0.122474487139158904909864203735E+01;
    x[1] =   0.0;
    x[2] =   0.122474487139158904909864203735E+01;

    w[0] = 1.3239311752136438; 
    w[1] = 1.1816359006036774;
    w[2] = 1.3239311752136438;
  }
  else if ( n == 4 )
  {
    x[0] = - 0.165068012388578455588334111112E+01;
    x[1] = - 0.524647623275290317884060253835;
    x[2] =   0.524647623275290317884060253835;
    x[3] =   0.165068012388578455588334111112E+01;

    w[0] = 1.2402258176958150;
    w[1] = 1.0599644828949693;
    w[2] = 1.0599644828949693;
    w[3] = 1.2402258176958150;
  }
  else if ( n == 5 )
  {
    x[0] = - 0.202018287045608563292872408814E+01;
    x[1] = - 0.958572464613818507112770593893;
    x[2] =   0.0;
    x[3] =   0.958572464613818507112770593893;
    x[4] =   0.202018287045608563292872408814E+01;

    w[0] = 1.1814886255359869;
    w[1] = 0.98658099675142830;
    w[2] = 0.94530872048294190;
    w[3] = 0.98658099675142830;
    w[4] = 1.1814886255359869;
  }
  else if ( n == 6 )
  {
    x[0] = - 0.235060497367449222283392198706E+01;
    x[1] = - 0.133584907401369694971489528297E+01;
    x[2] = - 0.436077411927616508679215948251;
    x[3] =   0.436077411927616508679215948251;
    x[4] =   0.133584907401369694971489528297E+01;
    x[5] =   0.235060497367449222283392198706E+01;

    w[0] = 1.1369083326745253;
    w[1] = 0.93558055763118075;
    w[2] = 0.87640133443623058;
    w[3] = 0.87640133443623058;
    w[4] = 0.93558055763118075;
    w[5] = 1.1369083326745253;
  }
  else if ( n == 7 )
  {
    x[0] = - 0.265196135683523349244708200652E+01;
    x[1] = - 0.167355162876747144503180139830E+01;
    x[2] = - 0.816287882858964663038710959027;
    x[3] =   0.0;
    x[4] =   0.816287882858964663038710959027;
    x[5] =   0.167355162876747144503180139830E+01;
    x[6] =   0.265196135683523349244708200652E+01;

    w[0] = 1.1013307296103216;
    w[1] = 0.89718460022518409;
    w[2] = 0.82868730328363926;
    w[3] = 0.81026461755680734;
    w[4] = 0.82868730328363926;
    w[5] = 0.89718460022518409;
    w[6] = 1.1013307296103216;
  }
  else if ( n == 8 )
  {
    x[0] = - 0.293063742025724401922350270524E+01;
    x[1] = - 0.198165675669584292585463063977E+01;
    x[2] = - 0.115719371244678019472076577906E+01;
    x[3] = - 0.381186990207322116854718885584;
    x[4] =   0.381186990207322116854718885584;
    x[5] =   0.115719371244678019472076577906E+01;
    x[6] =   0.198165675669584292585463063977E+01;
    x[7] =   0.293063742025724401922350270524E+01;

    w[0] = 1.0719301442479805;
    w[1] = 0.86675260656338138;
    w[2] = 0.79289004838640131;
    w[3] = 0.76454412865172916;
    w[4] = 0.76454412865172916;
    w[5] = 0.79289004838640131;
    w[6] = 0.86675260656338138;
    w[7] = 1.0719301442479805;
  }
  else if ( n == 9 )
  {
    x[0] = - 0.319099320178152760723004779538E+01;
    x[1] = - 0.226658058453184311180209693284E+01;
    x[2] = - 0.146855328921666793166701573925E+01;
    x[3] = - 0.723551018752837573322639864579;
    x[4] =   0.0;
    x[5] =   0.723551018752837573322639864579;
    x[6] =   0.146855328921666793166701573925E+01;
    x[7] =   0.226658058453184311180209693284E+01;
    x[8] =   0.319099320178152760723004779538E+01;

    w[0] = 1.0470035809766838;
    w[1] = 0.84175270147867043;
    w[2] = 0.76460812509455023;
    w[3] = 0.73030245274509220;
    w[4] = 0.72023521560605097;
    w[5] = 0.73030245274509220;
    w[6] = 0.76460812509455023;
    w[7] = 0.84175270147867043;
    w[8] = 1.0470035809766838;
  }
  else if ( n == 10 )
  {
    x[0] =  - 0.343615911883773760332672549432E+01;
    x[1] =  - 0.253273167423278979640896079775E+01;
    x[2] =  - 0.175668364929988177345140122011E+01;
    x[3] =  - 0.103661082978951365417749191676E+01;
    x[4] =  - 0.342901327223704608789165025557;
    x[5] =    0.342901327223704608789165025557;
    x[6] =    0.103661082978951365417749191676E+01;
    x[7] =    0.175668364929988177345140122011E+01;
    x[8] =    0.253273167423278979640896079775E+01;
    x[9] =   0.343615911883773760332672549432E+01;

    w[0] = 1.0254516913657352;
    w[1] = 0.82066612640481640;
    w[2] = 0.74144193194356511;
    w[3] = 0.70329632310490608;
    w[4] = 0.68708185395127341;
    w[5] = 0.68708185395127341;
    w[6] = 0.70329632310490608;
    w[7] = 0.74144193194356511;
    w[8] = 0.82066612640481640;
    w[9] = 1.0254516913657352;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "HERMITE_1_SET - Fatal error!\n";
    std::cerr << "  Illegal value of N = " << n << "\n";
    std::cerr << "  Legal values are 1 to 10.\n";
    exit ( 1 );
  }
  return;
}